

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

Interface * __thiscall
gl4cts::EnhancedLayouts::Utils::ProgramInterface::CloneBlockForStage
          (ProgramInterface *this,Interface *block,STAGES stage,STORAGE storage,GLchar *prefix)

{
  Interface *this_00;
  string name;
  size_t position;
  
  std::__cxx11::string::string((string *)&name,(string *)&block->m_name);
  position = 0;
  replaceToken(prefix,&position,GetStagePrefix::lut[stage][storage],&name);
  this_00 = findInterfaceByName(&this->m_blocks,name._M_dataplus._M_p);
  if (this_00 == (Interface *)0x0) {
    this_00 = AddInterface(this,name._M_dataplus._M_p,BLOCK);
  }
  std::
  vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
  ::operator=(&this_00->m_members,&block->m_members);
  std::__cxx11::string::~string((string *)&name);
  return this_00;
}

Assistant:

Interface* ProgramInterface::CloneBlockForStage(const Interface& block, Shader::STAGES stage, Variable::STORAGE storage,
												const GLchar* prefix)
{
	/* Get name */
	std::string name = block.m_name;

	/* Prefix name with stage ID */
	size_t		  position	 = 0;
	const GLchar* stage_prefix = GetStagePrefix(stage, storage);
	Utils::replaceToken(prefix, position, stage_prefix, name);

	Interface* ptr = GetBlock(name.c_str());

	if (0 == ptr)
	{
		ptr = AddInterface(name.c_str(), Interface::BLOCK);
	}

	ptr->m_members = block.m_members;

	return ptr;
}